

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O0

void __thiscall network::network(network *this)

{
  network *this_local;
  
  inetwork::inetwork(&this->super_inetwork);
  (this->super_inetwork)._vptr_inetwork = (_func_int **)&PTR_update_00112b28;
  std::map<int,_iobject_*,_std::less<int>,_std::allocator<std::pair<const_int,_iobject_*>_>_>::map
            (&this->objects_);
  this->last_netid_ = 0;
  this->frame_ = (iframe *)0x0;
  return;
}

Assistant:

network::network()
{
    last_netid_ = 0;
    frame_ = NULL;
}